

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_1::GLPositionCase::init
          (GLPositionCase *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  CaseType CVar2;
  Context *this_00;
  RenderContext *renderCtx;
  int iVar3;
  RenderTarget *renderTarget;
  ShaderProgram *this_01;
  ProgramSources *pPVar4;
  TestError *this_02;
  char *in_RCX;
  TessPrimitiveType primType;
  char *pcVar5;
  char *__s;
  undefined1 local_480 [40];
  undefined1 local_458 [40];
  undefined1 local_430 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  string fragmentShaderTemplate;
  undefined1 local_3c8 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  string tessellationEvaluationTemplate;
  string tesIn2;
  string tesIn1;
  string tesIn0;
  string local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  string tessellationControlTemplate;
  string vertexShaderTemplate;
  ProgramSources local_100;
  
  checkTessellationSupport((this->super_TestCase).m_context);
  renderTarget = Context::getRenderTarget((this->super_TestCase).m_context);
  checkRenderTargetSize(renderTarget,0x100);
  CVar2 = this->m_caseType;
  uVar1 = CVar2 - CASETYPE_TCS_TO_TES;
  pcVar5 = "in_te_attr[0]";
  if (uVar1 < 2) {
    pcVar5 = "gl_in[0].gl_Position";
  }
  __s = "in_te_attr[1]";
  if (uVar1 < 2) {
    __s = "gl_in[1].gl_Position";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tesIn0,pcVar5,(allocator<char> *)&local_100);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tesIn1,__s,(allocator<char> *)&local_100);
  pcVar5 = "in_te_attr[2]";
  if (uVar1 < 2) {
    pcVar5 = "gl_in[2].gl_Position";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tesIn2,pcVar5,(allocator<char> *)&local_100);
  pcVar5 = "out highp vec4 in_tc_attr;\n";
  if ((CVar2 & ~CASETYPE_VS_TO_TCS_TO_TES) == CASETYPE_VS_TO_TCS) {
    pcVar5 = SSBOArrayLengthTests::init::arraysSized + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_480,pcVar5,(allocator<char> *)local_3c8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_458,
                 "${GLSL_VERSION_DECL}\n\nin highp vec4 in_v_attr;\n",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_480);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_430,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_458,
                 "\nvoid main (void)\n{\n\t");
  pcVar5 = "in_tc_attr";
  if ((CVar2 & ~CASETYPE_VS_TO_TCS_TO_TES) == CASETYPE_VS_TO_TCS) {
    pcVar5 = "gl_Position";
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_100,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_430,
                 pcVar5);
  std::operator+(&vertexShaderTemplate,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_100,
                 " = in_v_attr;\n}\n");
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)local_430);
  std::__cxx11::string::~string((string *)local_458);
  std::__cxx11::string::~string((string *)local_480);
  pcVar5 = "in highp vec4 in_tc_attr[];\n";
  if ((CVar2 & ~CASETYPE_VS_TO_TCS_TO_TES) == CASETYPE_VS_TO_TCS) {
    pcVar5 = SSBOArrayLengthTests::init::arraysSized + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_408,pcVar5,(allocator<char> *)&local_3a0);
  std::operator+(&fragmentShaderTemplate,
                 "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\n\nlayout (vertices = 3) out;\n\n"
                 ,&local_408);
  std::operator+(&tessellationEvaluationTemplate,&fragmentShaderTemplate,"\n");
  pcVar5 = "out highp vec4 in_te_attr[];\n";
  if (uVar1 < 2) {
    pcVar5 = SSBOArrayLengthTests::init::arraysSized + 1;
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c8,
                 &tessellationEvaluationTemplate,pcVar5);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_480,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c8,
                 "\nvoid main (void)\n{\n\t");
  pcVar5 = "in_te_attr[gl_InvocationID]";
  if (uVar1 < 2) {
    pcVar5 = "gl_out[gl_InvocationID].gl_Position";
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_458,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_480,
                 pcVar5);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_430,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_458,
                 " = ");
  pcVar5 = "in_tc_attr[gl_InvocationID]";
  if ((CVar2 & ~CASETYPE_VS_TO_TCS_TO_TES) == CASETYPE_VS_TO_TCS) {
    pcVar5 = "gl_in[gl_InvocationID].gl_Position";
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_100,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_430,
                 pcVar5);
  std::operator+(&tessellationControlTemplate,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_100,
                 ";\n\n\tgl_TessLevelInner[0] = 2.0;\n\tgl_TessLevelInner[1] = 3.0;\n\n\tgl_TessLevelOuter[0] = 4.0;\n\tgl_TessLevelOuter[1] = 5.0;\n\tgl_TessLevelOuter[2] = 6.0;\n\tgl_TessLevelOuter[3] = 7.0;\n}\n"
                );
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)local_430);
  std::__cxx11::string::~string((string *)local_458);
  std::__cxx11::string::~string((string *)local_480);
  std::__cxx11::string::~string((string *)local_3c8);
  std::__cxx11::string::~string((string *)&tessellationEvaluationTemplate);
  std::__cxx11::string::~string((string *)&fragmentShaderTemplate);
  std::__cxx11::string::~string((string *)&local_408);
  (anonymous_namespace)::getTessellationEvaluationInLayoutString_abi_cxx11_
            (&local_2a0,(_anonymous_namespace_ *)0x0,primType,SUB81(in_RCX,0));
  std::operator+(&local_280,"${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\n\n",&local_2a0);
  std::operator+(&local_260,&local_280,"\n");
  pcVar5 = "in highp vec4 in_te_attr[];\n";
  if (uVar1 < 2) {
    pcVar5 = SSBOArrayLengthTests::init::arraysSized + 1;
  }
  std::operator+(&local_240,&local_260,pcVar5);
  std::operator+(&local_220,&local_240,
                 "\nout highp vec4 in_f_color;\n\nvoid main (void)\n{\n\thighp vec2 xy = gl_TessCoord.x * "
                );
  std::operator+(&local_200,&local_220,&tesIn0);
  std::operator+(&local_1e0,&local_200,".xy\n\t              + gl_TessCoord.y * ");
  std::operator+(&local_1c0,&local_1e0,&tesIn1);
  std::operator+(&local_1a0,&local_1c0,".xy\n\t              + gl_TessCoord.z * ");
  std::operator+(&local_180,&local_1a0,&tesIn2);
  std::operator+(&local_160,&local_180,
                 ".xy;\n\tgl_Position = vec4(xy, 0.0, 1.0);\n\tin_f_color = vec4(");
  std::operator+(&local_380,&local_160,&tesIn0);
  std::operator+(&local_360,&local_380,".z + ");
  std::operator+(&local_340,&local_360,&tesIn1);
  std::operator+(&local_3a0,&local_340,".w,\n\t                  ");
  std::operator+(&local_408,&local_3a0,&tesIn2);
  std::operator+(&fragmentShaderTemplate,&local_408,".z + ");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c8,
                 &fragmentShaderTemplate,&tesIn0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_480,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c8,
                 ".w,\n\t                  ");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_458,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_480,
                 &tesIn1);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_430,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_458,
                 ".z + ");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_100,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_430,
                 &tesIn2);
  std::operator+(&tessellationEvaluationTemplate,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_100,
                 ".w,\n\t                  1.0);\n}\n");
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)local_430);
  std::__cxx11::string::~string((string *)local_458);
  std::__cxx11::string::~string((string *)local_480);
  std::__cxx11::string::~string((string *)local_3c8);
  std::__cxx11::string::~string((string *)&fragmentShaderTemplate);
  std::__cxx11::string::~string((string *)&local_408);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::__cxx11::string::~string((string *)&local_340);
  std::__cxx11::string::~string((string *)&local_360);
  std::__cxx11::string::~string((string *)&local_380);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fragmentShaderTemplate,
             "${GLSL_VERSION_DECL}\n\nlayout (location = 0) out mediump vec4 o_color;\n\nin highp vec4 in_f_color;\n\nvoid main (void)\n{\n\to_color = in_f_color;\n}\n"
             ,(allocator<char> *)&local_100);
  this_01 = (ShaderProgram *)operator_new(0xd0);
  this_00 = (this->super_TestCase).m_context;
  renderCtx = this_00->m_renderCtx;
  memset(&local_100,0,0xac);
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_100._193_8_ = 0;
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_408,(_anonymous_namespace_ *)this_00,
             (Context *)vertexShaderTemplate._M_dataplus._M_p,in_RCX);
  glu::VertexSource::VertexSource((VertexSource *)local_430,&local_408);
  pPVar4 = glu::ProgramSources::operator<<(&local_100,(ShaderSource *)local_430);
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_3a0,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
             (Context *)tessellationControlTemplate._M_dataplus._M_p,in_RCX);
  glu::TessellationControlSource::TessellationControlSource
            ((TessellationControlSource *)local_458,&local_3a0);
  pPVar4 = glu::ProgramSources::operator<<(pPVar4,(ShaderSource *)local_458);
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_340,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
             (Context *)tessellationEvaluationTemplate._M_dataplus._M_p,in_RCX);
  glu::TessellationEvaluationSource::TessellationEvaluationSource
            ((TessellationEvaluationSource *)local_480,&local_340);
  pPVar4 = glu::ProgramSources::operator<<(pPVar4,(ShaderSource *)local_480);
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_360,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
             (Context *)fragmentShaderTemplate._M_dataplus._M_p,in_RCX);
  glu::FragmentSource::FragmentSource((FragmentSource *)local_3c8,&local_360);
  pPVar4 = glu::ProgramSources::operator<<(pPVar4,(ShaderSource *)local_3c8);
  glu::ShaderProgram::ShaderProgram(this_01,renderCtx,pPVar4);
  de::SharedPtr<const_glu::ShaderProgram>::SharedPtr
            ((SharedPtr<const_glu::ShaderProgram> *)&local_380,this_01);
  de::SharedPtr<const_glu::ShaderProgram>::operator=
            (&this->m_program,(SharedPtr<const_glu::ShaderProgram> *)&local_380);
  de::SharedPtr<const_glu::ShaderProgram>::~SharedPtr
            ((SharedPtr<const_glu::ShaderProgram> *)&local_380);
  std::__cxx11::string::~string((string *)(local_3c8 + 8));
  std::__cxx11::string::~string((string *)&local_360);
  std::__cxx11::string::~string((string *)(local_480 + 8));
  std::__cxx11::string::~string((string *)&local_340);
  std::__cxx11::string::~string((string *)(local_458 + 8));
  std::__cxx11::string::~string((string *)&local_3a0);
  std::__cxx11::string::~string((string *)(local_430 + 8));
  std::__cxx11::string::~string((string *)&local_408);
  glu::ProgramSources::~ProgramSources(&local_100);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  (this->m_program).m_ptr);
  if ((((this->m_program).m_ptr)->m_program).m_info.linkOk != false) {
    std::__cxx11::string::~string((string *)&fragmentShaderTemplate);
    std::__cxx11::string::~string((string *)&tessellationEvaluationTemplate);
    std::__cxx11::string::~string((string *)&tessellationControlTemplate);
    std::__cxx11::string::~string((string *)&vertexShaderTemplate);
    std::__cxx11::string::~string((string *)&tesIn2);
    std::__cxx11::string::~string((string *)&tesIn1);
    iVar3 = std::__cxx11::string::~string((string *)&tesIn0);
    return iVar3;
  }
  this_02 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_02,"Program compilation failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
             ,0x1914);
  __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void GLPositionCase::init (void)
{
	checkTessellationSupport(m_context);
	checkRenderTargetSize(m_context.getRenderTarget(), RENDER_SIZE);

	const bool		vsToTCS		= m_caseType == CASETYPE_VS_TO_TCS		|| m_caseType == CASETYPE_VS_TO_TCS_TO_TES;
	const bool		tcsToTES	= m_caseType == CASETYPE_TCS_TO_TES		|| m_caseType == CASETYPE_VS_TO_TCS_TO_TES;

	const string	tesIn0		= tcsToTES ? "gl_in[0].gl_Position" : "in_te_attr[0]";
	const string	tesIn1		= tcsToTES ? "gl_in[1].gl_Position" : "in_te_attr[1]";
	const string	tesIn2		= tcsToTES ? "gl_in[2].gl_Position" : "in_te_attr[2]";

	std::string vertexShaderTemplate			("${GLSL_VERSION_DECL}\n"
												 "\n"
												 "in highp vec4 in_v_attr;\n"
												 + string(!vsToTCS ? "out highp vec4 in_tc_attr;\n" : "") +
												 "\n"
												 "void main (void)\n"
												 "{\n"
												 "	" + (vsToTCS ? "gl_Position" : "in_tc_attr") + " = in_v_attr;\n"
												 "}\n");
	std::string tessellationControlTemplate		("${GLSL_VERSION_DECL}\n"
												 "${TESSELLATION_SHADER_REQUIRE}\n"
												 "\n"
												 "layout (vertices = 3) out;\n"
												 "\n"
												 + string(!vsToTCS ? "in highp vec4 in_tc_attr[];\n" : "") +
												 "\n"
												 + (!tcsToTES ? "out highp vec4 in_te_attr[];\n" : "") +
												 "\n"
												 "void main (void)\n"
												 "{\n"
												 "	" + (tcsToTES ? "gl_out[gl_InvocationID].gl_Position" : "in_te_attr[gl_InvocationID]") + " = "
													  + (vsToTCS ? "gl_in[gl_InvocationID].gl_Position" : "in_tc_attr[gl_InvocationID]") + ";\n"
												 "\n"
												 "	gl_TessLevelInner[0] = 2.0;\n"
												 "	gl_TessLevelInner[1] = 3.0;\n"
												 "\n"
												 "	gl_TessLevelOuter[0] = 4.0;\n"
												 "	gl_TessLevelOuter[1] = 5.0;\n"
												 "	gl_TessLevelOuter[2] = 6.0;\n"
												 "	gl_TessLevelOuter[3] = 7.0;\n"
												 "}\n");
	std::string tessellationEvaluationTemplate	("${GLSL_VERSION_DECL}\n"
												 "${TESSELLATION_SHADER_REQUIRE}\n"
												 "\n"
												 + getTessellationEvaluationInLayoutString(TESSPRIMITIVETYPE_TRIANGLES) +
												 "\n"
												 + (!tcsToTES ? "in highp vec4 in_te_attr[];\n" : "") +
												 "\n"
												 "out highp vec4 in_f_color;\n"
												 "\n"
												 "void main (void)\n"
												 "{\n"
												 "	highp vec2 xy = gl_TessCoord.x * " + tesIn0 + ".xy\n"
												 "	              + gl_TessCoord.y * " + tesIn1 + ".xy\n"
												 "	              + gl_TessCoord.z * " + tesIn2 + ".xy;\n"
												 "	gl_Position = vec4(xy, 0.0, 1.0);\n"
												 "	in_f_color = vec4(" + tesIn0 + ".z + " + tesIn1 + ".w,\n"
												 "	                  " + tesIn2 + ".z + " + tesIn0 + ".w,\n"
												 "	                  " + tesIn1 + ".z + " + tesIn2 + ".w,\n"
												 "	                  1.0);\n"
												 "}\n");
	std::string fragmentShaderTemplate			("${GLSL_VERSION_DECL}\n"
												 "\n"
												 "layout (location = 0) out mediump vec4 o_color;\n"
												 "\n"
												 "in highp vec4 in_f_color;\n"
												 "\n"
												 "void main (void)\n"
												 "{\n"
												 "	o_color = in_f_color;\n"
												 "}\n");

	m_program = SharedPtr<const ShaderProgram>(new ShaderProgram(m_context.getRenderContext(), glu::ProgramSources()
		<< glu::VertexSource					(specializeShader(m_context, vertexShaderTemplate.c_str()))
		<< glu::TessellationControlSource		(specializeShader(m_context, tessellationControlTemplate.c_str()))
		<< glu::TessellationEvaluationSource	(specializeShader(m_context, tessellationEvaluationTemplate.c_str()))
		<< glu::FragmentSource					(specializeShader(m_context, fragmentShaderTemplate.c_str()))));

	m_testCtx.getLog() << *m_program;
	if (!m_program->isOk())
		TCU_FAIL("Program compilation failed");
}